

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lift.h
# Opt level: O2

LatticeComparison __thiscall
wasm::analysis::Lift<wasm::RandomLattice>::compare
          (Lift<wasm::RandomLattice> *this,Element *a,Element *b)

{
  bool bVar1;
  LatticeComparison LVar2;
  
  bVar1 = (b->super_optional<wasm::RandomElement<wasm::RandomLattice>_>).
          super__Optional_base<wasm::RandomElement<wasm::RandomLattice>,_false,_false>._M_payload.
          super__Optional_payload<wasm::RandomElement<wasm::RandomLattice>,_true,_false,_false>.
          super__Optional_payload_base<wasm::RandomElement<wasm::RandomLattice>_>._M_engaged;
  if ((a->super_optional<wasm::RandomElement<wasm::RandomLattice>_>).
      super__Optional_base<wasm::RandomElement<wasm::RandomLattice>,_false,_false>._M_payload.
      super__Optional_payload<wasm::RandomElement<wasm::RandomLattice>,_true,_false,_false>.
      super__Optional_payload_base<wasm::RandomElement<wasm::RandomLattice>_>._M_engaged == false) {
    LVar2 = bVar1 + EQUAL;
  }
  else {
    if (bVar1 != false) {
      LVar2 = RandomLattice::compare(&this->lattice,(Element *)a,(Element *)b);
      return LVar2;
    }
    LVar2 = GREATER;
  }
  return LVar2;
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    if (a.isBottom() && b.isBottom()) {
      return EQUAL;
    } else if (a.isBottom()) {
      return LESS;
    } else if (b.isBottom()) {
      return GREATER;
    } else {
      return lattice.compare(*a, *b);
    }
  }